

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

int mbedtls_sha512_self_test(int verbose)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uchar sha512sum [64];
  uchar buf [1024];
  mbedtls_sha512_context local_558;
  uchar local_478 [64];
  uchar local_438 [1032];
  
  memset(local_558.buffer,0,0x88);
  uVar3 = 0;
  do {
    while( true ) {
      uVar4 = (uint)uVar3 - 3;
      if (uVar3 < 3) {
        uVar4 = (uint)uVar3;
      }
      if (verbose != 0) {
        printf("  SHA-%d test #%d: ",(ulong)((uint)(2 < uVar3) * 0x80 + 0x180),(ulong)(uVar4 + 1));
      }
      local_558.total[0] = 0;
      local_558.total[1] = 0;
      local_558.state[0]._0_4_ = 0xf3bcc908;
      local_558.state[0]._4_4_ = 0x6a09e667;
      local_558.state[1]._0_4_ = 0x84caa73b;
      local_558.state[1]._4_4_ = 0xbb67ae85;
      local_558.state[2]._0_4_ = 0xfe94f82b;
      local_558.state[2]._4_4_ = 0x3c6ef372;
      local_558.state[3]._0_4_ = 0x5f1d36f1;
      local_558.state[3]._4_4_ = 0xa54ff53a;
      local_558.state[4]._0_4_ = 0xade682d1;
      local_558.state[4]._4_4_ = 0x510e527f;
      local_558.state[5]._0_4_ = 0x2b3e6c1f;
      local_558.state[5]._4_4_ = 0x9b05688c;
      local_558.state[6]._0_4_ = 0xfb41bd6b;
      local_558.state[6]._4_4_ = 0x1f83d9ab;
      local_558.state[7]._0_4_ = 0x137e2179;
      local_558.state[7]._4_4_ = 0x5be0cd19;
      if (uVar3 < 3) {
        local_558.state[0]._0_4_ = 0xc1059ed8;
        local_558.state[0]._4_4_ = 0xcbbb9d5d;
        local_558.state[1]._0_4_ = 0x367cd507;
        local_558.state[1]._4_4_ = 0x629a292a;
        local_558.state[2]._0_4_ = 0x3070dd17;
        local_558.state[2]._4_4_ = 0x9159015a;
        local_558.state[3]._0_4_ = 0xf70e5939;
        local_558.state[3]._4_4_ = 0x152fecd8;
        local_558.state[4]._0_4_ = 0xffc00b31;
        local_558.state[4]._4_4_ = 0x67332667;
        local_558.state[5]._0_4_ = 0x68581511;
        local_558.state[5]._4_4_ = 0x8eb44a87;
        local_558.state[6]._0_4_ = 0x64f98fa7;
        local_558.state[6]._4_4_ = 0xdb0c2e0d;
        local_558.state[7]._0_4_ = 0xbefa4fa4;
        local_558.state[7]._4_4_ = 0x47b5481d;
      }
      local_558.is384 = (int)(uVar3 < 3);
      if (uVar4 == 2) {
        memset(local_438,0x61,1000);
        iVar2 = 1000;
        do {
          mbedtls_sha512_update(&local_558,local_438,1000);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      else {
        mbedtls_sha512_update(&local_558,sha512_test_buf[uVar4],(long)sha512_test_buflen[uVar4]);
      }
      mbedtls_sha512_finish(&local_558,local_478);
      iVar2 = bcmp(local_478,sha512_test_sum + uVar3,(ulong)(2 < uVar3) * 0x10 + 0x30);
      if (iVar2 != 0) {
        iVar2 = 1;
        if (verbose != 0) {
          puts("failed");
        }
        goto LAB_0012f75f;
      }
      if (verbose != 0) break;
      uVar3 = uVar3 + 1;
      if (uVar3 == 6) {
LAB_0012f75d:
        iVar2 = 0;
LAB_0012f75f:
        lVar1 = 0;
        do {
          *(undefined1 *)((long)local_558.total + lVar1) = 0;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0xd8);
        return iVar2;
      }
    }
    puts("passed");
    uVar3 = uVar3 + 1;
  } while (uVar3 != 6);
  putchar(10);
  goto LAB_0012f75d;
}

Assistant:

int mbedtls_sha512_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha512sum[64];
    mbedtls_sha512_context ctx;

    mbedtls_sha512_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 512 - k * 128, j + 1 );

        mbedtls_sha512_starts( &ctx, k );

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
                mbedtls_sha512_update( &ctx, buf, buflen );
        }
        else
            mbedtls_sha512_update( &ctx, sha512_test_buf[j],
                                 sha512_test_buflen[j] );

        mbedtls_sha512_finish( &ctx, sha512sum );

        if( memcmp( sha512sum, sha512_test_sum[i], 64 - k * 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_sha512_free( &ctx );

    return( ret );
}